

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

int glfwGetMouseButton(GLFWwindow *handle,int button)

{
  uint in_ESI;
  long in_RDI;
  _GLFWwindow *window;
  int local_4;
  
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    local_4 = 0;
  }
  else if (((int)in_ESI < 0) || (7 < (int)in_ESI)) {
    _glfwInputError(0x10003,"Invalid mouse button %i",(ulong)in_ESI);
    local_4 = 0;
  }
  else if (*(char *)(in_RDI + 0x78 + (long)(int)in_ESI) == '\x03') {
    *(undefined1 *)(in_RDI + 0x78 + (long)(int)in_ESI) = 0;
    local_4 = 1;
  }
  else {
    local_4 = (int)*(char *)(in_RDI + 0x78 + (long)(int)in_ESI);
  }
  return local_4;
}

Assistant:

GLFWAPI int glfwGetMouseButton(GLFWwindow* handle, int button)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_RELEASE);

    if (button < GLFW_MOUSE_BUTTON_1 || button > GLFW_MOUSE_BUTTON_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid mouse button %i", button);
        return GLFW_RELEASE;
    }

    if (window->mouseButtons[button] == _GLFW_STICK)
    {
        // Sticky mode: release mouse button now
        window->mouseButtons[button] = GLFW_RELEASE;
        return GLFW_PRESS;
    }

    return (int) window->mouseButtons[button];
}